

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_url_tests.cpp
# Opt level: O0

void __thiscall
common_url_tests::decode_internal_nulls_test::test_method(decode_internal_nulls_test *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  string result2;
  string result1;
  char *in_stack_fffffffffffffe28;
  lazy_ostream *in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe38;
  allocator<char> *in_stack_fffffffffffffe40;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe48;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  const_string *in_stack_fffffffffffffe60;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffffe68;
  unit_test_log_t *this_00;
  undefined1 local_148 [8];
  string_view in_stack_fffffffffffffec0;
  unit_test_log_t local_f1 [2];
  undefined1 local_e0 [16];
  undefined1 local_d0 [71];
  allocator<char> local_89;
  undefined1 local_88 [32];
  lazy_ostream local_68 [2];
  undefined1 local_48 [32];
  lazy_ostream local_28 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (in_stack_fffffffffffffe58,
             (char *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
             (size_type)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  std::allocator<char>::~allocator(&local_89);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe38,
               (pointer)in_stack_fffffffffffffe30,(unsigned_long)in_stack_fffffffffffffe28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,(size_t)in_stack_fffffffffffffe58
               ,(const_string *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffe30,(char (*) [1])in_stack_fffffffffffffe28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe38,
               (pointer)in_stack_fffffffffffffe30,(unsigned_long)in_stack_fffffffffffffe28);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40);
    UrlDecode_abi_cxx11_(in_stack_fffffffffffffec0);
    in_stack_fffffffffffffe38 = "result1";
    in_stack_fffffffffffffe30 = local_28;
    in_stack_fffffffffffffe28 = "UrlDecode(\"%00%00x%00%00\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_d0,local_e0,0x46,1,2,local_48);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe28);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffe28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  this_00 = local_f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (in_stack_fffffffffffffe58,
             (char *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50),
             (size_type)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40);
  std::allocator<char>::~allocator((allocator<char> *)local_f1);
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe38,
               (pointer)in_stack_fffffffffffffe30,(unsigned_long)in_stack_fffffffffffffe28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,file,(size_t)in_stack_fffffffffffffe58,
               (const_string *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
    in_stack_fffffffffffffe58 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffe30,(char (*) [1])in_stack_fffffffffffffe28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe38,
               (pointer)in_stack_fffffffffffffe30,(unsigned_long)in_stack_fffffffffffffe28);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40);
    UrlDecode_abi_cxx11_(in_stack_fffffffffffffec0);
    in_stack_fffffffffffffe38 = "result2";
    in_stack_fffffffffffffe30 = local_68;
    in_stack_fffffffffffffe28 = "UrlDecode(\"abc%00%00\")";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (&stack0xfffffffffffffec8,local_148,0x48,1,2,local_88);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe28);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffe28);
    in_stack_fffffffffffffe57 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffe57);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe28);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(decode_internal_nulls_test) {
    std::string result1{"\0\0x\0\0", 5};
    BOOST_CHECK_EQUAL(UrlDecode("%00%00x%00%00"), result1);
    std::string result2{"abc\0\0", 5};
    BOOST_CHECK_EQUAL(UrlDecode("abc%00%00"), result2);
}